

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u64le(CBS *cbs,uint64_t *out)

{
  uint8_t *puVar1;
  int iVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar2 = 0;
  if (7 < cbs->len) {
    puVar1 = cbs->data;
    cbs->data = puVar1 + 8;
    cbs->len = cbs->len - 8;
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar6 = uVar5 << 8;
      uVar4 = (ulong)puVar1[lVar3];
      uVar5 = uVar4 | uVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    *out = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar4 << 0x38;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}